

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigManager.cpp
# Opt level: O3

ChannelPtr __thiscall cali::ConfigManager::get_channel(ConfigManager *this,char *name)

{
  undefined8 *puVar1;
  int iVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined8 *puVar3;
  ChannelPtr CVar4;
  string local_50;
  
  puVar3 = (undefined8 *)**(long **)name;
  puVar1 = (undefined8 *)(*(long **)name)[1];
  if (puVar3 != puVar1) {
    do {
      ChannelController::name_abi_cxx11_(&local_50,(ChannelController *)*puVar3);
      iVar2 = std::__cxx11::string::compare((char *)&local_50);
      in_RDX._M_pi = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        in_RDX._M_pi = extraout_RDX_00;
      }
      if (iVar2 == 0) {
        (this->mP).
        super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)*puVar3;
        in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
        (this->mP).
        super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = in_RDX._M_pi;
        if (in_RDX._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (in_RDX._M_pi)->_M_use_count = (in_RDX._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (in_RDX._M_pi)->_M_use_count = (in_RDX._M_pi)->_M_use_count + 1;
          }
        }
        goto LAB_001e716d;
      }
      puVar3 = puVar3 + 2;
    } while (puVar3 != puVar1);
  }
  (this->mP).super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->mP).super___shared_ptr<cali::ConfigManager::ConfigManagerImpl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001e716d:
  CVar4.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar4.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ChannelPtr)CVar4.super___shared_ptr<cali::ChannelController,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ConfigManager::ChannelPtr ConfigManager::get_channel(const char* name) const
{
    for (ChannelPtr& chn : mP->m_channels)
        if (chn->name() == name)
            return chn;

    return ChannelPtr();
}